

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

Gia_Man_t * Abc_NtkAigToGiaTwo(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fByName)

{
  uint uVar1;
  Nm_Man_t *pNVar2;
  ulong uVar3;
  Vec_Int_t *p;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vMap;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  uint local_4c;
  Vec_Int_t *local_48;
  
  if ((pNtk1->ntkFunc != ABC_FUNC_AIG) || (pNtk1->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                  ,0x7f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if ((pNtk2->ntkFunc != ABC_FUNC_AIG) || (pNtk2->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                  ,0x80,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  vMap = Vec_IntStartNatural(pNtk1->vCis->nSize);
  iVar9 = pNtk2->vCis->nSize;
  if (fByName == 0) {
    local_48 = Vec_IntStartNatural(iVar9);
    iVar9 = local_48->nSize;
    if (local_48->nSize < vMap->nSize) {
      iVar9 = vMap->nSize;
    }
    uVar5 = pNtk1->vCis->nSize;
    uVar1 = pNtk2->vCis->nSize;
    if ((int)uVar5 < (int)uVar1) {
      uVar1 = uVar5;
    }
    printf("Matched %d vars by order.",(ulong)uVar1);
    iVar10 = pNtk1->vCis->nSize;
    iVar4 = pNtk2->vCis->nSize;
    if (iVar4 - iVar10 != 0 && iVar10 <= iVar4) {
      printf(" The last %d vars of Netlist2 are unmatched vars.",(ulong)(uint)(iVar4 - iVar10));
      iVar10 = pNtk1->vCis->nSize;
      iVar4 = pNtk2->vCis->nSize;
    }
    if (iVar10 <= iVar4) goto LAB_0027cc2b;
    pcVar7 = " The last %d vars of Netlist1 are unmatched vars.";
  }
  else {
    local_48 = Vec_IntAlloc(iVar9);
    for (iVar9 = 0; iVar10 = pNtk1->vCis->nSize, iVar9 < iVar10; iVar9 = iVar9 + 1) {
      pAVar6 = Abc_NtkCi(pNtk1,iVar9);
      (pAVar6->field_6).iTemp = iVar9;
    }
    if (iVar9 != iVar10) {
      __assert_fail("Index == Abc_NtkCiNum(pNtk1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                    ,0x89,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    local_4c = 0;
    for (iVar10 = 0; iVar10 < pNtk2->vCis->nSize; iVar10 = iVar10 + 1) {
      pAVar6 = Abc_NtkCi(pNtk2,iVar10);
      pNVar2 = pNtk1->pManName;
      pcVar7 = Abc_ObjName(pAVar6);
      iVar4 = Nm_ManFindIdByName(pNVar2,pcVar7,2);
      if (iVar4 < 0) {
        pNVar2 = pNtk1->pManName;
        pcVar7 = Abc_ObjName(pAVar6);
        iVar4 = Nm_ManFindIdByName(pNVar2,pcVar7,5);
        if (-1 < iVar4) goto LAB_0027cb0a;
        Vec_IntPush(local_48,iVar9);
        iVar9 = iVar9 + 1;
      }
      else {
LAB_0027cb0a:
        pAVar6 = Abc_NtkObj(pNtk1,iVar4);
        uVar5 = *(uint *)&pAVar6->field_0x14 & 0xf;
        if ((uVar5 != 2) && (uVar5 != 5)) {
          __assert_fail("Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                        ,0x8f,"Gia_Man_t *Abc_NtkAigToGiaTwo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
        }
        pAVar6 = Abc_NtkObj(pNtk1,iVar4);
        Vec_IntPush(local_48,(pAVar6->field_6).iTemp);
        local_4c = local_4c + 1;
      }
    }
    printf("Matched %d vars by name.",(ulong)local_4c);
    if (pNtk1->vCis->nSize != local_4c) {
      printf(" Netlist1 has %d unmatched vars.");
    }
    if (pNtk2->vCis->nSize == local_4c) goto LAB_0027cc2b;
    pcVar7 = " Netlist2 has %d unmatched vars.";
  }
  printf(pcVar7);
LAB_0027cc2b:
  putchar(10);
  p_00 = Gia_ManStart(10000);
  pcVar7 = Abc_UtilStrsav(pNtk1->pName);
  p_00->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(pNtk1->pSpec);
  iVar10 = 0;
  if (0 < iVar9) {
    iVar10 = iVar9;
  }
  p_00->pSpec = pcVar7;
  while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
    pGVar8 = Gia_ManAppendObj(p_00);
    uVar3 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
    *(ulong *)pGVar8 =
         uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    p = p_00->vCis;
    iVar9 = Gia_ObjId(p_00,pGVar8);
    Vec_IntPush(p,iVar9);
    Gia_ObjId(p_00,pGVar8);
  }
  Gia_ManHashAlloc(p_00);
  Abc_NtkAigToGiaOne(p_00,pNtk1,vMap);
  Abc_NtkAigToGiaOne(p_00,pNtk2,local_48);
  Gia_ManHashStop(p_00);
  Vec_IntFree(vMap);
  Vec_IntFree(local_48);
  Gia_ManCreateValueRefs(p_00);
  iVar9 = 0;
  while( true ) {
    if (p_00->nObjs <= iVar9) {
      return p_00;
    }
    pGVar8 = Gia_ManObj(p_00,iVar9);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) && (pGVar8->Value == 0))
    {
      iVar10 = Abc_Var2Lit(iVar9,0);
      Gia_ManAppendCo(p_00,iVar10);
    }
    iVar9 = iVar9 + 1;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Abc_NtkAigToGiaTwo( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fByName )
{
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Abc_Obj_t * pNode;
    Vec_Int_t * vMap1, * vMap2;
    int i, Index = 0;
    assert( Abc_NtkIsAigLogic(pNtk1) );
    assert( Abc_NtkIsAigLogic(pNtk2) );
    // find common variables
    if ( fByName )
    {
        int nCommon = 0;
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntAlloc( Abc_NtkCiNum(pNtk2) );
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = Index++;
        assert( Index == Abc_NtkCiNum(pNtk1) );
        Abc_NtkForEachCi( pNtk2, pNode, i )
        {
            int Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_PI );
            if ( Num < 0 )
                Num = Nm_ManFindIdByName( pNtk1->pManName, Abc_ObjName(pNode), ABC_OBJ_BO );
            assert( Num < 0 || Abc_ObjIsCi(Abc_NtkObj(pNtk1, Num)) );
            if ( Num >= 0 )
                Vec_IntPush( vMap2, Abc_NtkObj(pNtk1, Num)->iTemp ), nCommon++;
            else
                Vec_IntPush( vMap2, Index++ );
        }
        // report
        printf( "Matched %d vars by name.", nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk1) )
            printf( " Netlist1 has %d unmatched vars.", Abc_NtkCiNum(pNtk1) - nCommon );
        if ( nCommon != Abc_NtkCiNum(pNtk2) )
            printf( " Netlist2 has %d unmatched vars.", Abc_NtkCiNum(pNtk2) - nCommon );
        printf( "\n" );
    }
    else
    {
        vMap1 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk1) );
        vMap2 = Vec_IntStartNatural( Abc_NtkCiNum(pNtk2) );
        Index = Abc_MaxInt( Vec_IntSize(vMap1), Vec_IntSize(vMap2) );
        // report
        printf( "Matched %d vars by order.", Abc_MinInt(Abc_NtkCiNum(pNtk1), Abc_NtkCiNum(pNtk2)) );
        if ( Abc_NtkCiNum(pNtk1) < Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist2 are unmatched vars.", Abc_NtkCiNum(pNtk2) - Abc_NtkCiNum(pNtk1) );
        if ( Abc_NtkCiNum(pNtk1) > Abc_NtkCiNum(pNtk2) )
            printf( " The last %d vars of Netlist1 are unmatched vars.", Abc_NtkCiNum(pNtk1) - Abc_NtkCiNum(pNtk2) );
        printf( "\n" );
    }
    // create new manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( Abc_NtkName(pNtk1) );
    p->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk1) );
    for ( i = 0; i < Index; i++ )
        Gia_ManAppendCi(p);
    // add logic
    Gia_ManHashAlloc( p );
    Abc_NtkAigToGiaOne( p, pNtk1, vMap1 );
    Abc_NtkAigToGiaOne( p, pNtk2, vMap2 );
    Gia_ManHashStop( p );
    Vec_IntFree( vMap1 );
    Vec_IntFree( vMap2 );
    // add extra POs to dangling nodes
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->Value == 0 )
            Gia_ManAppendCo( p, Abc_Var2Lit(i, 0) );
    return p;
}